

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O2

int ON::IsOpenNURBSFile(FILE *fp)

{
  int iVar1;
  bool bVar2;
  int version;
  ON_String sStartSectionComment;
  ON_BinaryFile archive;
  
  ON_String::ON_String(&sStartSectionComment);
  version = 0;
  if (fp != (FILE *)0x0) {
    ON_BinaryFile::ON_BinaryFile(&archive,read3dm,fp);
    bVar2 = ON_BinaryArchive::Read3dmStartSection
                      (&archive.super_ON_BinaryArchive,&version,&sStartSectionComment);
    if (!bVar2) {
      version = 0;
    }
    ON_BinaryFile::~ON_BinaryFile(&archive);
  }
  iVar1 = version;
  ON_String::~ON_String(&sStartSectionComment);
  return iVar1;
}

Assistant:

int ON::IsOpenNURBSFile( FILE* fp )
{
  ON_String sStartSectionComment;
  int version = 0;
  if ( 0 != fp )
  {
    ON_BinaryFile archive(ON::archive_mode::read3dm,fp);
    if ( !archive.Read3dmStartSection(&version,sStartSectionComment) )
      version = 0;
  }
  return version;
}